

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_application_feature_info
               (Hasher *hasher,StateRecorderApplicationFeatureHash *base_hash)

{
  StateRecorderApplicationFeatureHash *base_hash_local;
  Hasher *hasher_local;
  
  Hasher::u64(hasher,base_hash->application_info_hash);
  Hasher::u64(hasher,base_hash->physical_device_features_hash);
  return;
}

Assistant:

static void hash_application_feature_info(Hasher &hasher, const StateRecorderApplicationFeatureHash &base_hash)
{
	// This makes it so two different applications won't conflict if they use the same pipelines.
	hasher.u64(base_hash.application_info_hash);
	hasher.u64(base_hash.physical_device_features_hash);
}